

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O3

bool __thiscall
glslang::HlslParseContext::setTextureReturnType
          (HlslParseContext *this,TSampler *sampler,TType *retType,TSourceLoc *loc)

{
  TTypeList *pTVar1;
  pointer pTVar2;
  pointer ppTVar3;
  pointer ppTVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  pointer pTVar9;
  ulong uVar10;
  char *pcVar11;
  ulong uVar12;
  ulong uVar13;
  _func_int **pp_Var14;
  TTypeList *members;
  TTypeList *local_38;
  
  sampler->field_0x3 = sampler->field_0x3 | 0x1e;
  iVar6 = (*retType->_vptr_TType[0x1d])(retType);
  if ((char)iVar6 == '\0') {
    iVar6 = (*retType->_vptr_TType[0x1b])(retType);
    if (((char)iVar6 != '\0') ||
       (iVar6 = (*retType->_vptr_TType[0x18])(retType), (char)iVar6 != '\0')) {
      uVar7 = (*retType->_vptr_TType[0xc])(retType);
      *sampler = (TSampler)((uint)*sampler & 0xfe3fffff | (uVar7 & 7) << 0x16);
      return true;
    }
    iVar6 = (*retType->_vptr_TType[0x25])(retType);
    if ((char)iVar6 == '\0') {
      pp_Var14 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar11 = "Invalid texture template type";
    }
    else if (sampler->field_0x1 == '\a') {
      pp_Var14 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar11 = "Unimplemented: structure template type in subpass input";
    }
    else {
      iVar6 = (*retType->_vptr_TType[0x25])(retType);
      if ((char)iVar6 == '\0') {
        __assert_fail("isStruct()",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                      ,0x9e1,"TTypeList *glslang::TType::getWritableStruct() const");
      }
      pTVar1 = (retType->field_13).structure;
      pTVar9 = (pTVar1->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
               ).super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pTVar2 = (pTVar1->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
               ).super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      local_38 = pTVar1;
      if ((ulong)((long)pTVar2 - (long)pTVar9) < 0x81 && pTVar2 != pTVar9) {
        uVar7 = 0;
        uVar10 = 0;
        uVar12 = 1;
        do {
          iVar6 = (*(pTVar9[uVar10].type)->_vptr_TType[0x18])();
          if (((char)iVar6 == '\0') &&
             (iVar6 = (*((pTVar1->
                         super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                         ).
                         super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar10].type)->_vptr_TType[0x1b])
                                (), (char)iVar6 == '\0')) {
            pp_Var14 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
            pcVar11 = "Invalid texture template struct member type";
            goto LAB_0041e3d9;
          }
          iVar6 = (*((pTVar1->
                     super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                     super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar10].type)->_vptr_TType[0xc])();
          uVar7 = uVar7 + iVar6;
          if (4 < uVar7) {
            pp_Var14 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
            pcVar11 = "Too many components in texture template structure type";
            goto LAB_0041e3d9;
          }
          iVar6 = (*((pTVar1->
                     super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                     super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar10].type)->_vptr_TType[7])();
          iVar8 = (*((pTVar1->
                     super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                     super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                     ._M_impl.super__Vector_impl_data._M_start)->type->_vptr_TType[7])();
          if (iVar6 != iVar8) {
            pp_Var14 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
            pcVar11 = "Texture template structure members must same basic type";
            goto LAB_0041e3d9;
          }
          pTVar9 = (pTVar1->
                   super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                   super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          bVar5 = uVar12 < (ulong)((long)(pTVar1->
                                         super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                         ).
                                         super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar9
                                  >> 5);
          uVar10 = uVar12;
          uVar12 = (ulong)((int)uVar12 + 1);
        } while (bVar5);
        ppTVar3 = (this->textureReturnStruct).
                  super_vector<glslang::TVector<glslang::TTypeLoc>_*,_glslang::pool_allocator<glslang::TVector<glslang::TTypeLoc>_*>_>
                  .
                  super__Vector_base<glslang::TVector<glslang::TTypeLoc>_*,_glslang::pool_allocator<glslang::TVector<glslang::TTypeLoc>_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppTVar4 = (this->textureReturnStruct).
                  super_vector<glslang::TVector<glslang::TTypeLoc>_*,_glslang::pool_allocator<glslang::TVector<glslang::TTypeLoc>_*>_>
                  .
                  super__Vector_base<glslang::TVector<glslang::TTypeLoc>_*,_glslang::pool_allocator<glslang::TVector<glslang::TTypeLoc>_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        uVar10 = (long)ppTVar4 - (long)ppTVar3 >> 3;
        if (ppTVar4 != ppTVar3) {
          uVar7 = 0;
          uVar12 = 0;
          uVar13 = 1;
          do {
            if (ppTVar3[uVar12] == pTVar1) {
              *sampler = (TSampler)((uint)*sampler & 0xe1ffffff | uVar7 & 0x1e000000);
              return true;
            }
            uVar7 = uVar7 + 0x2000000;
            bVar5 = uVar13 < uVar10;
            uVar12 = uVar13;
            uVar13 = (ulong)((int)uVar13 + 1);
          } while (bVar5);
        }
        if (uVar10 < 0xf) {
          *sampler = (TSampler)((uint)*sampler & 0xe1ffffff | (int)uVar10 << 0x19);
          std::
          vector<glslang::TVector<glslang::TTypeLoc>_*,_glslang::pool_allocator<glslang::TVector<glslang::TTypeLoc>_*>_>
          ::push_back(&(this->textureReturnStruct).
                       super_vector<glslang::TVector<glslang::TTypeLoc>_*,_glslang::pool_allocator<glslang::TVector<glslang::TTypeLoc>_*>_>
                      ,&local_38);
          return true;
        }
        pp_Var14 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar11 = "Texture template struct return slots exceeded";
      }
      else {
        pp_Var14 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar11 = "Invalid member count in texture template structure";
      }
    }
  }
  else {
    pp_Var14 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar11 = "Arrays not supported in texture template types";
  }
LAB_0041e3d9:
  (*pp_Var14[0x2d])(this,loc,pcVar11,"","");
  return false;
}

Assistant:

bool HlslParseContext::setTextureReturnType(TSampler& sampler, const TType& retType, const TSourceLoc& loc)
{
    // Seed the output with an invalid index.  We will set it to a valid one if we can.
    sampler.structReturnIndex = TSampler::noReturnStruct;

    // Arrays aren't supported.
    if (retType.isArray()) {
        error(loc, "Arrays not supported in texture template types", "", "");
        return false;
    }

    // If return type is a vector, remember the vector size in the sampler, and return.
    if (retType.isVector() || retType.isScalar()) {
        sampler.vectorSize = retType.getVectorSize();
        return true;
    }

    // If it wasn't a vector, it must be a struct meeting certain requirements.  The requirements
    // are checked below: just check for struct-ness here.
    if (!retType.isStruct()) {
        error(loc, "Invalid texture template type", "", "");
        return false;
    }

    // TODO: Subpass doesn't handle struct returns, due to some oddities with fn overloading.
    if (sampler.isSubpass()) {
        error(loc, "Unimplemented: structure template type in subpass input", "", "");
        return false;
    }

    TTypeList* members = retType.getWritableStruct();

    // Check for too many or not enough structure members.
    if (members->size() > 4 || members->size() == 0) {
        error(loc, "Invalid member count in texture template structure", "", "");
        return false;
    }

    // Error checking: We must have <= 4 total components, all of the same basic type.
    unsigned totalComponents = 0;
    for (unsigned m = 0; m < members->size(); ++m) {
        // Check for bad member types
        if (!(*members)[m].type->isScalar() && !(*members)[m].type->isVector()) {
            error(loc, "Invalid texture template struct member type", "", "");
            return false;
        }

        const unsigned memberVectorSize = (*members)[m].type->getVectorSize();
        totalComponents += memberVectorSize;

        // too many total member components
        if (totalComponents > 4) {
            error(loc, "Too many components in texture template structure type", "", "");
            return false;
        }

        // All members must be of a common basic type
        if ((*members)[m].type->getBasicType() != (*members)[0].type->getBasicType()) {
            error(loc, "Texture template structure members must same basic type", "", "");
            return false;
        }
    }

    // If the structure in the return type already exists in the table, we'll use it.  Otherwise, we'll make
    // a new entry.  This is a linear search, but it hardly ever happens, and the list cannot be very large.
    for (unsigned int idx = 0; idx < textureReturnStruct.size(); ++idx) {
        if (textureReturnStruct[idx] == members) {
            sampler.structReturnIndex = idx;
            return true;
        }
    }

    // It wasn't found as an existing entry.  See if we have room for a new one.
    if (textureReturnStruct.size() >= TSampler::structReturnSlots) {
        error(loc, "Texture template struct return slots exceeded", "", "");
        return false;
    }

    // Insert it in the vector that tracks struct return types.
    sampler.structReturnIndex = unsigned(textureReturnStruct.size());
    textureReturnStruct.push_back(members);

    // Success!
    return true;
}